

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

void bssl::dtls1_next_message(SSL *ssl)

{
  uint16_t *puVar1;
  undefined1 *puVar2;
  ushort uVar3;
  DTLS1_STATE *pDVar4;
  bool bVar5;
  
  if ((ssl->s3->field_0xdc & 8) == 0) {
    __assert_fail("ssl->s3->has_message",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x1c4,"void bssl::dtls1_next_message(SSL *)");
  }
  bVar5 = dtls1_is_current_message_complete(ssl);
  if (bVar5) {
    std::__uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)
               (ssl->d1->incoming_messages + ssl->d1->handshake_read_seq % 7),(pointer)0x0);
    pDVar4 = ssl->d1;
    puVar1 = &pDVar4->handshake_read_seq;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 == 0) {
      *(byte *)pDVar4 = *(byte *)pDVar4 | 0x10;
    }
    puVar2 = &ssl->s3->field_0xdc;
    *(ushort *)puVar2 = *(ushort *)puVar2 & 0xfff7;
    uVar3 = *(ushort *)ssl->d1;
    if ((uVar3 & 2) != 0) {
      *(ushort *)ssl->d1 = uVar3 | 4;
    }
    return;
  }
  __assert_fail("dtls1_is_current_message_complete(ssl)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                ,0x1c5,"void bssl::dtls1_next_message(SSL *)");
}

Assistant:

void dtls1_next_message(SSL *ssl) {
  assert(ssl->s3->has_message);
  assert(dtls1_is_current_message_complete(ssl));
  size_t index = ssl->d1->handshake_read_seq % SSL_MAX_HANDSHAKE_FLIGHT;
  ssl->d1->incoming_messages[index].reset();
  ssl->d1->handshake_read_seq++;
  if (ssl->d1->handshake_read_seq == 0) {
    ssl->d1->handshake_read_overflow = true;
  }
  ssl->s3->has_message = false;
  // If we previously sent a flight, mark it as having a reply, so
  // |on_handshake_complete| can manage post-handshake retransmission.
  if (ssl->d1->outgoing_messages_complete) {
    ssl->d1->flight_has_reply = true;
  }
}